

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O3

void __thiscall embree::ISPCScene::commit(ISPCScene *this)

{
  ulong uVar1;
  
  if (this->numGeometries != 0) {
    uVar1 = 0;
    do {
      rtcAttachGeometryByID(this->scene,this->geometries[uVar1]->geometry,uVar1 & 0xffffffff);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->numGeometries);
  }
  rtcCommitScene(this->scene);
  return;
}

Assistant:

void ISPCScene::commit()
  {
    for (unsigned int geomID=0; geomID<numGeometries; geomID++)
    {
      ISPCGeometry* geometry = geometries[geomID];
      rtcAttachGeometryByID(scene,geometry->geometry,geomID);
    }

    rtcCommitScene(scene);
  }